

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xmlXPathCmpNodesExt(xmlNodePtr node1,xmlNodePtr node2)

{
  xmlElementType xVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  _xmlNode *p_Var4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  xmlNodePtr pxVar8;
  xmlNodePtr pxVar9;
  int iVar10;
  xmlNodePtr pxVar11;
  int iVar12;
  _xmlNode *p_Var13;
  xmlNodePtr pxVar14;
  uint uVar15;
  
  if (node2 == (xmlNodePtr)0x0 || node1 == (xmlNodePtr)0x0) {
    return -2;
  }
  if (node1 == node2) {
    return 0;
  }
  xVar1 = node1->type;
  uVar7 = 0;
  bVar5 = true;
  pxVar9 = node1;
  if (xVar1 < XML_XINCLUDE_START) {
    if ((0x198U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
      if (xVar1 != XML_ATTRIBUTE_NODE) {
        if (xVar1 == XML_NAMESPACE_DECL) {
          return 1;
        }
        goto LAB_001de2da;
      }
      uVar7 = 1;
      bVar5 = false;
      pxVar9 = node1->parent;
    }
    else {
      pxVar8 = node1;
      for (p_Var13 = node1->prev; p_Var13 != (xmlNodePtr)0x0; p_Var13 = p_Var13->prev) {
        if (p_Var13->type == XML_ELEMENT_NODE) {
          uVar15 = 3;
          goto LAB_001de30f;
        }
        pxVar8 = p_Var13;
      }
      p_Var13 = pxVar8->parent;
      if ((p_Var13 != (_xmlNode *)0x0) && (uVar15 = 2, p_Var13->type == XML_ELEMENT_NODE)) {
LAB_001de30f:
        if ((long)p_Var13->content < 0) {
          bVar5 = false;
          pxVar9 = p_Var13;
          uVar7 = uVar15;
        }
      }
    }
  }
  else {
LAB_001de2da:
    if ((xVar1 == XML_ELEMENT_NODE) && (node2->type == XML_ELEMENT_NODE)) {
      pxVar2 = node1->content;
      if ((-1 < (long)pxVar2) ||
         ((pxVar3 = node2->content, -1 < (long)pxVar3 || (node1->doc != node2->doc))))
      goto LAB_001de474;
      if ((long)pxVar3 < (long)pxVar2) {
        return 1;
      }
      if ((long)pxVar2 < (long)pxVar3) {
        return -1;
      }
    }
    uVar7 = 0;
    node1 = (_xmlNode *)0x0;
  }
  xVar1 = node2->type;
  if (xVar1 < XML_XINCLUDE_START) {
    p_Var13 = node2;
    if ((0x198U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0) {
      pxVar8 = node2->prev;
      pxVar14 = node2;
      while (pxVar11 = pxVar8, pxVar11 != (xmlNodePtr)0x0) {
        if (pxVar11->type == XML_ELEMENT_NODE) {
          uVar15 = 3;
          goto LAB_001de3bf;
        }
        pxVar14 = pxVar11;
        pxVar8 = pxVar11->prev;
      }
      pxVar11 = pxVar14->parent;
      if ((pxVar11 != (_xmlNode *)0x0) && (uVar15 = 2, pxVar11->type == XML_ELEMENT_NODE)) {
LAB_001de3bf:
        if ((long)pxVar11->content < 0) goto LAB_001de3ea;
      }
      goto LAB_001de3e6;
    }
    if (xVar1 != XML_ATTRIBUTE_NODE) {
      p_Var13 = (xmlNodePtr)0x0;
      if (xVar1 == XML_NAMESPACE_DECL) {
        return 1;
      }
      goto LAB_001de3e6;
    }
    pxVar11 = node2->parent;
    uVar15 = 1;
LAB_001de3ea:
    if (pxVar9 == pxVar11) {
      if (uVar7 != uVar15) {
        return (uint)(uVar7 < uVar15) * 2 + -1;
      }
      while( true ) {
        p_Var13 = p_Var13->prev;
        if (p_Var13 == (_xmlNode *)0x0) {
          return -1;
        }
        if (p_Var13 == node1) break;
        if (p_Var13->type == XML_ELEMENT_NODE) {
          return -1;
        }
      }
      return 1;
    }
    p_Var13 = pxVar9;
    if (1 < uVar7 && uVar15 == 3) {
      while (p_Var13 = p_Var13->parent, p_Var13 != (_xmlNode *)0x0) {
        if (p_Var13 == pxVar11) {
          return 1;
        }
      }
    }
    node2 = pxVar11;
    if (1 < uVar15 && uVar7 == 3) {
      while (pxVar11 = pxVar11->parent, pxVar11 != (xmlNodePtr)0x0) {
        if (pxVar11 == pxVar9) {
          return -1;
        }
      }
    }
  }
  else {
    p_Var13 = (xmlNodePtr)0x0;
LAB_001de3e6:
    pxVar11 = node2;
    uVar15 = 0;
    if (!bVar5) goto LAB_001de3ea;
  }
  node1 = pxVar9;
  if ((((pxVar9->type == XML_ELEMENT_NODE) && (node2->type == XML_ELEMENT_NODE)) &&
      (pxVar2 = pxVar9->content, (long)pxVar2 < 0)) &&
     ((pxVar3 = node2->content, (long)pxVar3 < 0 && (pxVar9->doc == node2->doc)))) {
    if ((long)pxVar3 < (long)pxVar2) {
      return 1;
    }
    if ((long)pxVar2 < (long)pxVar3) {
      return -1;
    }
  }
LAB_001de474:
  if (node1 == node2->prev) {
    return 1;
  }
  if (node1 == node2->next) {
    return -1;
  }
  iVar12 = 0;
  iVar10 = 0;
  pxVar9 = node2;
  if (node2->parent != (xmlNodePtr)0x0) {
    iVar10 = 0;
    pxVar8 = node2->parent;
    do {
      pxVar9 = pxVar8;
      if (pxVar9 == node1) {
        return 1;
      }
      iVar10 = iVar10 + 1;
      pxVar8 = pxVar9->parent;
    } while (pxVar9->parent != (_xmlNode *)0x0);
  }
  pxVar8 = node1;
  if (node1->parent != (_xmlNode *)0x0) {
    iVar12 = 0;
    p_Var13 = node1->parent;
    do {
      pxVar8 = p_Var13;
      if (pxVar8 == node2) {
        return -1;
      }
      iVar12 = iVar12 + 1;
      p_Var13 = pxVar8->parent;
    } while (pxVar8->parent != (_xmlNode *)0x0);
  }
  iVar6 = iVar12;
  if (pxVar9 == pxVar8) {
    for (; iVar10 < iVar12; iVar12 = iVar12 + -1) {
      node1 = node1->parent;
      iVar6 = iVar10;
    }
    for (; iVar6 < iVar10; iVar10 = iVar10 + -1) {
      node2 = node2->parent;
    }
    do {
      p_Var13 = node1->parent;
      p_Var4 = node2->parent;
      if (p_Var13 == p_Var4) {
        if (node1 == node2->prev) {
          return 1;
        }
        if (node1 == node2->next) {
          return -1;
        }
        if (((node1->type == XML_ELEMENT_NODE) && (node2->type == XML_ELEMENT_NODE)) &&
           ((pxVar2 = node1->content, (long)pxVar2 < 0 &&
            ((pxVar3 = node2->content, (long)pxVar3 < 0 && (node1->doc == node2->doc)))))) {
          if ((long)pxVar3 < (long)pxVar2) {
            return 1;
          }
          if ((long)pxVar2 < (long)pxVar3) {
            return -1;
          }
        }
        do {
          node1 = node1->next;
          if (node1 == (_xmlNode *)0x0) {
            return -1;
          }
        } while (node1 != node2);
        return 1;
      }
    } while ((p_Var13 != (_xmlNode *)0x0) &&
            (node1 = p_Var13, node2 = p_Var4, p_Var4 != (_xmlNode *)0x0));
  }
  return -2;
}

Assistant:

static int
xmlXPathCmpNodesExt(xmlNodePtr node1, xmlNodePtr node2) {
    int depth1, depth2;
    int misc = 0, precedence1 = 0, precedence2 = 0;
    xmlNodePtr miscNode1 = NULL, miscNode2 = NULL;
    xmlNodePtr cur, root;
    ptrdiff_t l1, l2;

    if ((node1 == NULL) || (node2 == NULL))
	return(-2);

    if (node1 == node2)
	return(0);

    /*
     * a couple of optimizations which will avoid computations in most cases
     */
    switch (node1->type) {
	case XML_ELEMENT_NODE:
	    if (node2->type == XML_ELEMENT_NODE) {
		if ((0 > (ptrdiff_t) node1->content) &&
		    (0 > (ptrdiff_t) node2->content) &&
		    (node1->doc == node2->doc))
		{
		    l1 = -((ptrdiff_t) node1->content);
		    l2 = -((ptrdiff_t) node2->content);
		    if (l1 < l2)
			return(1);
		    if (l1 > l2)
			return(-1);
		} else
		    goto turtle_comparison;
	    }
	    break;
	case XML_ATTRIBUTE_NODE:
	    precedence1 = 1; /* element is owner */
	    miscNode1 = node1;
	    node1 = node1->parent;
	    misc = 1;
	    break;
	case XML_TEXT_NODE:
	case XML_CDATA_SECTION_NODE:
	case XML_COMMENT_NODE:
	case XML_PI_NODE: {
	    miscNode1 = node1;
	    /*
	    * Find nearest element node.
	    */
	    if (node1->prev != NULL) {
		do {
		    node1 = node1->prev;
		    if (node1->type == XML_ELEMENT_NODE) {
			precedence1 = 3; /* element in prev-sibl axis */
			break;
		    }
		    if (node1->prev == NULL) {
			precedence1 = 2; /* element is parent */
			/*
			* URGENT TODO: Are there any cases, where the
			* parent of such a node is not an element node?
			*/
			node1 = node1->parent;
			break;
		    }
		} while (1);
	    } else {
		precedence1 = 2; /* element is parent */
		node1 = node1->parent;
	    }
	    if ((node1 == NULL) || (node1->type != XML_ELEMENT_NODE) ||
		(0 <= (ptrdiff_t) node1->content)) {
		/*
		* Fallback for whatever case.
		*/
		node1 = miscNode1;
		precedence1 = 0;
	    } else
		misc = 1;
	}
	    break;
	case XML_NAMESPACE_DECL:
	    /*
	    * TODO: why do we return 1 for namespace nodes?
	    */
	    return(1);
	default:
	    break;
    }
    switch (node2->type) {
	case XML_ELEMENT_NODE:
	    break;
	case XML_ATTRIBUTE_NODE:
	    precedence2 = 1; /* element is owner */
	    miscNode2 = node2;
	    node2 = node2->parent;
	    misc = 1;
	    break;
	case XML_TEXT_NODE:
	case XML_CDATA_SECTION_NODE:
	case XML_COMMENT_NODE:
	case XML_PI_NODE: {
	    miscNode2 = node2;
	    if (node2->prev != NULL) {
		do {
		    node2 = node2->prev;
		    if (node2->type == XML_ELEMENT_NODE) {
			precedence2 = 3; /* element in prev-sibl axis */
			break;
		    }
		    if (node2->prev == NULL) {
			precedence2 = 2; /* element is parent */
			node2 = node2->parent;
			break;
		    }
		} while (1);
	    } else {
		precedence2 = 2; /* element is parent */
		node2 = node2->parent;
	    }
	    if ((node2 == NULL) || (node2->type != XML_ELEMENT_NODE) ||
		(0 <= (ptrdiff_t) node2->content))
	    {
		node2 = miscNode2;
		precedence2 = 0;
	    } else
		misc = 1;
	}
	    break;
	case XML_NAMESPACE_DECL:
	    return(1);
	default:
	    break;
    }
    if (misc) {
	if (node1 == node2) {
	    if (precedence1 == precedence2) {
		/*
		* The ugly case; but normally there aren't many
		* adjacent non-element nodes around.
		*/
		cur = miscNode2->prev;
		while (cur != NULL) {
		    if (cur == miscNode1)
			return(1);
		    if (cur->type == XML_ELEMENT_NODE)
			return(-1);
		    cur = cur->prev;
		}
		return (-1);
	    } else {
		/*
		* Evaluate based on higher precedence wrt to the element.
		* TODO: This assumes attributes are sorted before content.
		*   Is this 100% correct?
		*/
		if (precedence1 < precedence2)
		    return(1);
		else
		    return(-1);
	    }
	}
	/*
	* Special case: One of the helper-elements is contained by the other.
	* <foo>
	*   <node2>
	*     <node1>Text-1(precedence1 == 2)</node1>
	*   </node2>
	*   Text-6(precedence2 == 3)
	* </foo>
	*/
	if ((precedence2 == 3) && (precedence1 > 1)) {
	    cur = node1->parent;
	    while (cur) {
		if (cur == node2)
		    return(1);
		cur = cur->parent;
	    }
	}
	if ((precedence1 == 3) && (precedence2 > 1)) {
	    cur = node2->parent;
	    while (cur) {
		if (cur == node1)
		    return(-1);
		cur = cur->parent;
	    }
	}
    }

    /*
     * Speedup using document order if available.
     */
    if ((node1->type == XML_ELEMENT_NODE) &&
	(node2->type == XML_ELEMENT_NODE) &&
	(0 > (ptrdiff_t) node1->content) &&
	(0 > (ptrdiff_t) node2->content) &&
	(node1->doc == node2->doc)) {

	l1 = -((ptrdiff_t) node1->content);
	l2 = -((ptrdiff_t) node2->content);
	if (l1 < l2)
	    return(1);
	if (l1 > l2)
	    return(-1);
    }

turtle_comparison:

    if (node1 == node2->prev)
	return(1);
    if (node1 == node2->next)
	return(-1);
    /*
     * compute depth to root
     */
    for (depth2 = 0, cur = node2; cur->parent != NULL; cur = cur->parent) {
	if (cur->parent == node1)
	    return(1);
	depth2++;
    }
    root = cur;
    for (depth1 = 0, cur = node1; cur->parent != NULL; cur = cur->parent) {
	if (cur->parent == node2)
	    return(-1);
	depth1++;
    }
    /*
     * Distinct document (or distinct entities :-( ) case.
     */
    if (root != cur) {
	return(-2);
    }
    /*
     * get the nearest common ancestor.
     */
    while (depth1 > depth2) {
	depth1--;
	node1 = node1->parent;
    }
    while (depth2 > depth1) {
	depth2--;
	node2 = node2->parent;
    }
    while (node1->parent != node2->parent) {
	node1 = node1->parent;
	node2 = node2->parent;
	/* should not happen but just in case ... */
	if ((node1 == NULL) || (node2 == NULL))
	    return(-2);
    }
    /*
     * Find who's first.
     */
    if (node1 == node2->prev)
	return(1);
    if (node1 == node2->next)
	return(-1);
    /*
     * Speedup using document order if available.
     */
    if ((node1->type == XML_ELEMENT_NODE) &&
	(node2->type == XML_ELEMENT_NODE) &&
	(0 > (ptrdiff_t) node1->content) &&
	(0 > (ptrdiff_t) node2->content) &&
	(node1->doc == node2->doc)) {

	l1 = -((ptrdiff_t) node1->content);
	l2 = -((ptrdiff_t) node2->content);
	if (l1 < l2)
	    return(1);
	if (l1 > l2)
	    return(-1);
    }

    for (cur = node1->next;cur != NULL;cur = cur->next)
	if (cur == node2)
	    return(1);
    return(-1); /* assume there is no sibling list corruption */
}